

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O2

size_t polyscope::pick::requestPickBufferRange(Structure *requestingStructure,size_t count)

{
  ulong uVar1;
  string sStack_58;
  tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*> local_38;
  
  uVar1 = nextPickBufferInd;
  if (CARRY8(count,nextPickBufferInd)) {
    std::__cxx11::string::string
              ((string *)&sStack_58,
               "Wow, you sure do have a lot of stuff, Polyscope can\'t even count it all. (Ran out of indices while enumerating structure elements for pick buffer.)"
               ,(allocator *)&local_38);
    error(&sStack_58);
    std::__cxx11::string::~string((string *)&sStack_58);
    uVar1 = nextPickBufferInd;
  }
  nextPickBufferInd = count + uVar1;
  local_38.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_polyscope::Structure_*>.
  super__Tuple_impl<1UL,_unsigned_long,_polyscope::Structure_*>.
  super__Tuple_impl<2UL,_polyscope::Structure_*>.
  super__Head_base<2UL,_polyscope::Structure_*,_false>._M_head_impl =
       (_Head_base<2UL,_polyscope::Structure_*,_false>)
       (_Head_base<2UL,_polyscope::Structure_*,_false>)requestingStructure;
  local_38.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_polyscope::Structure_*>.
  super__Tuple_impl<1UL,_unsigned_long,_polyscope::Structure_*>.
  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl = nextPickBufferInd;
  local_38.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_polyscope::Structure_*>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar1;
  std::
  vector<std::tuple<unsigned_long,unsigned_long,polyscope::Structure*>,std::allocator<std::tuple<unsigned_long,unsigned_long,polyscope::Structure*>>>
  ::emplace_back<std::tuple<unsigned_long,unsigned_long,polyscope::Structure*>>
            ((vector<std::tuple<unsigned_long,unsigned_long,polyscope::Structure*>,std::allocator<std::tuple<unsigned_long,unsigned_long,polyscope::Structure*>>>
              *)&structureRanges,&local_38);
  return uVar1;
}

Assistant:

size_t requestPickBufferRange(Structure* requestingStructure, size_t count) {

  // Check if we can satisfy the request
  size_t maxPickInd = std::numeric_limits<size_t>::max();
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wshift-count-overflow"
  if (bitsForPickPacking < 22) {
    uint64_t bitMax = 1ULL << (bitsForPickPacking * 3);
    if (bitMax < maxPickInd) {
      maxPickInd = bitMax;
    }
  }
#pragma GCC diagnostic pop

  if (count > maxPickInd || maxPickInd - count < nextPickBufferInd) {
    error("Wow, you sure do have a lot of stuff, Polyscope can't even count it all. (Ran out of indices while "
          "enumerating structure elements for pick buffer.)");
  }

  size_t ret = nextPickBufferInd;
  nextPickBufferInd += count;
  structureRanges.push_back(std::make_tuple(ret, nextPickBufferInd, requestingStructure));
  return ret;
}